

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionarySGL<true,_false>::search_key(DictionarySGL<true,_false> *this,char *key)

{
  bool bVar1;
  char *in_RSI;
  Query agent;
  Query *in_stack_ffffffffffffffd0;
  DaTrie<true,_false,_false> *in_stack_ffffffffffffffd8;
  uint32_t local_4;
  
  Query::Query((Query *)&stack0xffffffffffffffd0,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                *)0x15f478);
  bVar1 = DaTrie<true,_false,_false>::search_key
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_4 = Query::value((Query *)&stack0xffffffffffffffd0);
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query((Query *)&stack0xffffffffffffffd0);
  return local_4;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query agent(key);
    if (!trie_->search_key(agent)) {
      return NOT_FOUND;
    }
    return agent.value();
  }